

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::image::anon_unknown_0::SizeTest::createInstance(SizeTest *this,Context *context)

{
  SizeTestInstance *pSVar1;
  ImageType IVar2;
  VkFormat VVar3;
  deUint32 dVar4;
  VkBufferView obj;
  undefined8 uVar5;
  VkImage image;
  VkImageView obj_00;
  VkImageSubresourceRange subresourceRange;
  int iVar6;
  VkImageType VVar7;
  VkImageViewType imageViewType;
  SizeTestInstance *this_00;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  Allocator *pAVar10;
  TextureFormat format;
  Buffer *this_01;
  Image *this_02;
  VkDeviceSize bufferSize;
  VkImageCreateInfo imageParams;
  Move<vk::Handle<(vk::HandleType)12>_> local_c8;
  undefined1 local_a8 [20];
  VkImageType VStack_94;
  VkFormat VStack_90;
  deUint32 dStack_8c;
  VkBufferUsageFlags VStack_88;
  VkSharingMode local_84;
  deUint32 local_80;
  deUint32 local_7c;
  deUint32 *local_78;
  undefined8 uStack_70;
  deUint32 local_68;
  deUint32 *local_60;
  VkImageLayout local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  deUint32 local_38;
  
  IVar2 = (this->m_texture).m_type;
  this_00 = (SizeTestInstance *)operator_new(0xd8);
  if (IVar2 == IMAGE_TYPE_BUFFER) {
    SizeTestInstance::SizeTestInstance(this_00,context,&this->m_texture,this->m_format);
    (this_00->super_TestInstance)._vptr_TestInstance =
         (_func_int **)&PTR__BufferSizeTestInstance_00d33c28;
    pSVar1 = this_00 + 1;
    this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_00[1].m_texture.m_layerSize.m_data[0] = 0;
    this_00[1].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[1].m_texture.m_numLayers = 0;
    this_00[1].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[1].m_format = 0;
    this_00[1].m_resultBufferSizeBytes = 0;
    this_00[1].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[1].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_00[2].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_00[2].super_TestInstance.m_context = (Context *)0x0;
    this_00[2].m_texture.m_layerSize.m_data[0] = 0;
    this_00[2].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[2].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[2].m_texture.m_numLayers = 0;
    this_00[2].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[2].m_format = 0;
    this_00[2].m_resultBufferSizeBytes = 0;
    this_00[2].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[2].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    pDVar8 = Context::getDeviceInterface((this_00->super_TestInstance).m_context);
    pVVar9 = Context::getDevice((this_00->super_TestInstance).m_context);
    pAVar10 = Context::getDefaultAllocator((this_00->super_TestInstance).m_context);
    Texture::size(&this_00->m_texture);
    format = ::vk::mapVkFormat(this_00->m_format);
    iVar6 = tcu::getPixelSize(format);
    this_01 = (Buffer *)operator_new(0x30);
    bufferSize = (VkDeviceSize)(iVar6 * local_a8._0_4_ * local_a8._4_4_ * local_a8._8_4_);
    makeBufferCreateInfo((VkBufferCreateInfo *)local_a8,bufferSize,8);
    image::Buffer::Buffer
              (this_01,pDVar8,pVVar9,pAVar10,(VkBufferCreateInfo *)local_a8,(MemoryRequirement)0x0);
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    if ((Buffer *)(pSVar1->super_TestInstance)._vptr_TestInstance != this_01) {
      de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)pSVar1);
      (pSVar1->super_TestInstance)._vptr_TestInstance = (_func_int **)this_01;
    }
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_c8)
    ;
    makeBufferView(&local_c8,pDVar8,pVVar9,
                   (VkBuffer)this_00[1].super_TestInstance._vptr_TestInstance[2],this_00->m_format,0
                   ,bufferSize);
    stack0xffffffffffffff68 =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
    VStack_90 = (VkFormat)
                local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
    dStack_8c = (deUint32)
                ((ulong)local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
                        m_allocator >> 0x20);
    local_a8._0_8_ =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
    local_a8._8_8_ =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    obj.m_internal = *(deUint64 *)this_00[1].m_texture.m_layerSize.m_data;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)12>_> *)
                 (this_00[1].m_texture.m_layerSize.m_data + 2),obj);
      *(VkDevice *)&this_00[1].m_texture.m_numLayers = stack0xffffffffffffff68;
      *(ulong *)&this_00[1].m_format = CONCAT44(dStack_8c,VStack_90);
      *(undefined8 *)this_00[1].m_texture.m_layerSize.m_data = local_a8._0_8_;
      *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = local_a8._8_8_;
      if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal == 0) {
        return &this_00->super_TestInstance;
      }
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                 (VkBufferView)
                 local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
      return &this_00->super_TestInstance;
    }
  }
  else {
    SizeTestInstance::SizeTestInstance(this_00,context,&this->m_texture,this->m_format);
    (this_00->super_TestInstance)._vptr_TestInstance =
         (_func_int **)&PTR__ImageSizeTestInstance_00d33cd8;
    pSVar1 = this_00 + 1;
    this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_00[1].m_texture.m_layerSize.m_data[0] = 0;
    this_00[1].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[1].m_texture.m_numLayers = 0;
    this_00[1].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[1].m_format = 0;
    this_00[1].m_resultBufferSizeBytes = 0;
    this_00[1].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[1].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_00[2].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    this_00[2].super_TestInstance.m_context = (Context *)0x0;
    this_00[2].m_texture.m_layerSize.m_data[0] = 0;
    this_00[2].m_texture.m_layerSize.m_data[1] = 0;
    *(undefined8 *)(this_00[2].m_texture.m_layerSize.m_data + 2) = 0;
    this_00[2].m_texture.m_numLayers = 0;
    this_00[2].m_texture.m_numSamples = 0;
    *(undefined8 *)&this_00[2].m_format = 0;
    this_00[2].m_resultBufferSizeBytes = 0;
    this_00[2].m_resultBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[2].m_resultBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    pDVar8 = Context::getDeviceInterface((this_00->super_TestInstance).m_context);
    pVVar9 = Context::getDevice((this_00->super_TestInstance).m_context);
    pAVar10 = Context::getDefaultAllocator((this_00->super_TestInstance).m_context);
    this_02 = (Image *)operator_new(0x30);
    VVar3 = this_00->m_format;
    local_a8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    local_a8._8_8_ = (void *)0x0;
    IVar2 = (this_00->m_texture).m_type;
    local_a8._16_4_ = (uint)(IVar2 - IMAGE_TYPE_CUBE < 2) << 4;
    VVar7 = mapImageType(IVar2);
    VStack_94 = VVar7;
    uVar5 = *(undefined8 *)(this_00->m_texture).m_layerSize.m_data;
    local_84 = (this_00->m_texture).m_layerSize.m_data[2];
    dStack_8c = (deUint32)uVar5;
    VStack_88 = (VkBufferUsageFlags)((ulong)uVar5 >> 0x20);
    local_80 = 1;
    local_7c = (this_00->m_texture).m_numLayers;
    local_78 = (deUint32 *)&DAT_00000001;
    uStack_70._0_4_ = 8;
    uStack_70._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    local_68 = 0;
    local_60 = (deUint32 *)0x0;
    local_58 = VK_IMAGE_LAYOUT_UNDEFINED;
    VStack_90 = VVar3;
    Image::Image(this_02,pDVar8,pVVar9,pAVar10,(VkImageCreateInfo *)local_a8,(MemoryRequirement)0x0)
    ;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    if ((Image *)(pSVar1->super_TestInstance)._vptr_TestInstance != this_02) {
      de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)pSVar1);
      (pSVar1->super_TestInstance)._vptr_TestInstance = (_func_int **)this_02;
    }
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_c8);
    dVar4 = (this_00->m_texture).m_numLayers;
    image.m_internal = (deUint64)this_00[1].super_TestInstance._vptr_TestInstance[2];
    imageViewType = mapImageViewType((this_00->m_texture).m_type);
    local_48 = 1;
    uStack_40 = 1;
    subresourceRange.levelCount = 1;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.aspectMask = 1;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.layerCount = dVar4;
    local_38 = dVar4;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_c8,pDVar8,pVVar9,image,
                  imageViewType,this_00->m_format,subresourceRange);
    stack0xffffffffffffff68 =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
    VStack_90 = (VkFormat)
                local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
    dStack_8c = (deUint32)
                ((ulong)local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.
                        m_allocator >> 0x20);
    local_a8._0_8_ =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
    local_a8._8_8_ =
         local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    obj_00.m_internal = *(deUint64 *)this_00[1].m_texture.m_layerSize.m_data;
    if (obj_00.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 (this_00[1].m_texture.m_layerSize.m_data + 2),obj_00);
      *(VkDevice *)&this_00[1].m_texture.m_numLayers = stack0xffffffffffffff68;
      *(ulong *)&this_00[1].m_format = CONCAT44(dStack_8c,VStack_90);
      *(undefined8 *)this_00[1].m_texture.m_layerSize.m_data = local_a8._0_8_;
      *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = local_a8._8_8_;
      if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal == 0) {
        return &this_00->super_TestInstance;
      }
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
                 &local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                 (VkImageView)
                 local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal);
      return &this_00->super_TestInstance;
    }
  }
  *(VkDevice *)&this_00[1].m_texture.m_numLayers = stack0xffffffffffffff68;
  *(ulong *)&this_00[1].m_format = CONCAT44(dStack_8c,VStack_90);
  *(undefined8 *)this_00[1].m_texture.m_layerSize.m_data = local_a8._0_8_;
  *(undefined8 *)(this_00[1].m_texture.m_layerSize.m_data + 2) = local_a8._8_8_;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* SizeTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferSizeTestInstance(context, m_texture, m_format);
	else
		return new ImageSizeTestInstance(context, m_texture, m_format);
}